

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O3

int Gia_Sim2ClassRefineOne(Gia_Sim2_t *p,int i)

{
  Vec_Int_t *pVVar1;
  Gia_Obj_t *pGVar2;
  uint *puVar3;
  Vec_Int_t *p_00;
  int iVar4;
  int iVar5;
  uint Entry;
  Gia_Man_t *p_01;
  int iVar6;
  
  pVVar1 = p->vClassOld;
  pVVar1->nSize = 0;
  p->vClassNew->nSize = 0;
  Vec_IntPush(pVVar1,i);
  if (-1 < i) {
    iVar6 = 0;
    do {
      p_01 = p->pAig;
      if (p_01->nObjs <= i) break;
      if (((~(uint)p_01->pReprs[(uint)i] & 0xfffffff) != 0) ||
         (Entry = p_01->pNexts[(uint)i], (int)Entry < 1)) {
        __assert_fail("Gia_ObjIsHead(p->pAig, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSim2.c"
                      ,0x19b,"int Gia_Sim2ClassRefineOne(Gia_Sim2_t *, int)");
      }
      pGVar2 = p_01->pObjs;
      iVar5 = p->nWords;
      puVar3 = p->pDataSim;
      do {
        if (p_01->nObjs <= (int)Entry) goto LAB_00227d5e;
        iVar4 = Gia_Sim2CompareEqual
                          (puVar3 + (long)i * (long)iVar5,p->pDataSim + (int)(p->nWords * Entry),
                           p->nWords,
                           ((uint)((ulong)*(undefined8 *)(p_01->pObjs + Entry) >> 0x20) ^
                           (uint)((ulong)*(undefined8 *)(pGVar2 + (uint)i) >> 0x20)) >> 0x1f);
        Vec_IntPush((&p->vClassOld)[iVar4 == 0],Entry);
        p_01 = p->pAig;
        Entry = p_01->pNexts[Entry];
      } while (0 < (int)Entry);
      if (p->vClassNew->nSize == 0) {
        iVar5 = 0;
LAB_00227d86:
        return iVar5 + iVar6;
      }
      Gia_Sim2ClassCreate(p_01,p->vClassOld);
      Gia_Sim2ClassCreate(p->pAig,p->vClassNew);
      pVVar1 = p->vClassNew;
      if (pVVar1->nSize < 2) {
        iVar5 = 1;
        goto LAB_00227d86;
      }
      i = *pVVar1->pArray;
      iVar6 = iVar6 + 1;
      p_00 = p->vClassOld;
      p_00->nSize = 0;
      pVVar1->nSize = 0;
      Vec_IntPush(p_00,i);
    } while (-1 < i);
  }
LAB_00227d5e:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

int Gia_Sim2ClassRefineOne( Gia_Sim2_t * p, int i )
{
    Gia_Obj_t * pObj0, * pObj1;
    unsigned * pSim0, * pSim1;
    int Ent;
    Vec_IntClear( p->vClassOld );
    Vec_IntClear( p->vClassNew );
    Vec_IntPush( p->vClassOld, i );
    pObj0 = Gia_ManObj( p->pAig, i );
    pSim0 = Gia_Sim2Data( p, i );
    Gia_ClassForEachObj1( p->pAig, i, Ent )
    {
        pObj1 = Gia_ManObj( p->pAig, Ent );
        pSim1 = Gia_Sim2Data( p, Ent );
        if ( Gia_Sim2CompareEqual( pSim0, pSim1, p->nWords, Gia_ObjPhase(pObj0) ^ Gia_ObjPhase(pObj1) ) )
            Vec_IntPush( p->vClassOld, Ent );
        else
            Vec_IntPush( p->vClassNew, Ent );
    }
    if ( Vec_IntSize( p->vClassNew ) == 0 )
        return 0;
    Gia_Sim2ClassCreate( p->pAig, p->vClassOld );
    Gia_Sim2ClassCreate( p->pAig, p->vClassNew );
    if ( Vec_IntSize(p->vClassNew) > 1 )
        return 1 + Gia_Sim2ClassRefineOne( p, Vec_IntEntry(p->vClassNew,0) );
    return 1;
}